

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

void __thiscall flow::lang::Parser::importRuntime(Parser *this)

{
  bool bVar1;
  element_type *local_48;
  element_type **local_40;
  element_type **builtin;
  iterator __end3;
  iterator __begin3;
  UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
  *__range3;
  Parser *this_local;
  
  if (this->runtime_ != (Runtime *)0x0) {
    ___begin3 = Runtime::builtins(this->runtime_);
    __end3 = util::
             UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
             ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
                      *)&__begin3);
    builtin = (element_type **)
              util::
              UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
              ::end((UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
                     *)&__begin3);
    while (bVar1 = util::
                   UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
                   ::iterator::operator!=(&__end3,(iterator *)&builtin), bVar1) {
      local_48 = util::
                 UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
                 ::iterator::operator*(&__end3);
      local_40 = &local_48;
      declareBuiltin(this,local_48);
      util::
      UnboxedRange<std::vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>_>
      ::iterator::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void Parser::importRuntime() {
  if (runtime_) {
    for (const auto& builtin : runtime_->builtins()) {
      declareBuiltin(builtin);
    }
  }
}